

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::AdvancedBindingUpdate::Run(AdvancedBindingUpdate *this)

{
  CallLogWrapper *this_00;
  undefined8 *puVar1;
  bool bVar2;
  GLuint GVar3;
  GLint GVar4;
  undefined8 *puVar5;
  void *pvVar6;
  GLuint i;
  GLuint i_1;
  GLuint GVar7;
  long lVar8;
  GLuint *pGVar9;
  char *glsl_fs;
  char *glsl_vs;
  GLushort data [4];
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Vec3 local_90;
  Vec3 local_80;
  Vec3 local_70;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  local_b0 = 
  "#version 310 es\nlayout(location = 0) in vec4 vs_in_position;\nlayout(location = 1) in vec2 vs_in_color_rg;\nlayout(location = 2) in float vs_in_color_b;\nlayout(location = 3) in uvec3 vs_in_data0;\nlayout(location = 4) in ivec2 vs_in_data1;\nout vec2 color_rg;\nout float color_b;\nflat out uvec3 data0;\nflat out ivec2 data1;\nvoid main() {\n  data0 = vs_in_data0;\n  data1 = vs_in_data1;\n  color_b = vs_in_color_b;\n  color_rg = vs_in_color_rg;\n  gl_Position = vs_in_position;\n}"
  ;
  local_b8 = 
  "#version 310 es\nprecision highp float;\nprecision highp int;\nin vec2 color_rg;\nin float color_b;\nflat in uvec3 data0;\nflat in ivec2 data1;\nout vec4 fs_out_color;\nuniform uvec3 g_expected_data0;\nuniform ivec2 g_expected_data1;\nvoid main() {\n  fs_out_color = vec4(color_rg, color_b, 1);\n  if (data0 != g_expected_data0) fs_out_color = vec4(1);\n  if (data1 != g_expected_data1) fs_out_color = vec4(1);\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  if (this->pipeline == true) {
    GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&local_b0);
    this->m_vsp = GVar3;
    GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,1,&local_b8);
    this->m_fsp = GVar3;
    bVar2 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_vsp);
    if (!bVar2) {
      return -1;
    }
    bVar2 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_fsp);
    if (!bVar2) {
      return -1;
    }
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,2,this->m_fsp);
  }
  else {
    GVar3 = glu::CallLogWrapper::glCreateProgram(this_00);
    this->m_ppo = GVar3;
    GVar3 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    GVar7 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
    glu::CallLogWrapper::glShaderSource(this_00,GVar3,1,&local_b0,(GLint *)0x0);
    glu::CallLogWrapper::glShaderSource(this_00,GVar7,1,&local_b8,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar3);
    glu::CallLogWrapper::glCompileShader(this_00,GVar7);
    glu::CallLogWrapper::glAttachShader(this_00,this->m_ppo,GVar3);
    glu::CallLogWrapper::glAttachShader(this_00,this->m_ppo,GVar7);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar3);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar7);
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_ppo);
    bVar2 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_ppo);
    if (!bVar2) {
      return -1;
    }
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
  lVar8 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0xd0,(void *)0x0,0x88e4);
  puVar5 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8892,0,0xd0,2);
  *puVar5 = 0xbf800000bf800000;
  *(undefined8 *)((long)puVar5 + 0x34) = 0xbf8000003f800000;
  puVar5[0xd] = 0x3f8000003f800000;
  *(undefined8 *)((long)puVar5 + 0x9c) = 0x3f800000bf800000;
  do {
    puVar1 = (undefined8 *)((long)puVar5 + lVar8 + 8);
    *puVar1 = 0x3f80000000000000;
    puVar1[1] = 0x100000000;
    *(undefined8 *)((long)puVar5 + lVar8 + 0x18) = 0x300000002;
    *(undefined8 *)((long)puVar5 + lVar8 + 0x2c) = 0x200000001;
    lVar8 = lVar8 + 0x34;
  } while (lVar8 != 0xd0);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
  lVar8 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x108,(void *)0x0,0x88e4);
  pvVar6 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8892,0,0x108,2);
  *(undefined8 *)((long)pvVar6 + 8) = 0x3f800000bf800000;
  *(undefined8 *)((long)pvVar6 + 0x48) = 0x3f8000003f800000;
  *(undefined8 *)((long)pvVar6 + 0x88) = 0xbf8000003f800000;
  *(undefined8 *)((long)pvVar6 + 200) = 0xbf800000bf800000;
  do {
    puVar5 = (undefined8 *)((long)pvVar6 + lVar8 + 0x10);
    *puVar5 = 0;
    puVar5[1] = 0x43f800000;
    *(undefined8 *)((long)pvVar6 + lVar8 + 0x20) = 0x600000005;
    *(undefined8 *)((long)pvVar6 + lVar8 + 0x34) = 0x400000003;
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0x100);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
  GVar3 = 0;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[0]);
  local_a8 = 0x2000300010000;
  glu::CallLogWrapper::glBufferData(this_00,0x8893,8,&local_a8,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[1]);
  local_a8 = 0x200000003;
  uStack_a0 = 0x100000000;
  glu::CallLogWrapper::glBufferData(this_00,0x8893,0x10,&local_a8,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,1,2,0x1406,'\0',8);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,1,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,3,3,0x1405,0x14);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,4,2,0x1404,0x2c);
  do {
    glu::CallLogWrapper::glVertexAttribBinding(this_00,GVar3,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,GVar3);
    GVar3 = GVar3 + 1;
  } while (GVar3 != 5);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,1,2,0x1406,'\0',8);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,1,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,3,3,0x1405,0x14);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,4,2,0x1404,0x2c);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,1);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,1,8);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,1);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,3,1);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,4,8);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,3);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_vbo[1],8,0x40);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,8,this->m_vbo[0],0,0x34);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[1]);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  if (this->pipeline == false) {
    pGVar9 = &this->m_ppo;
    glu::CallLogWrapper::glUseProgram(this_00,this->m_ppo);
  }
  else {
    glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_ppo);
    pGVar9 = &this->m_fsp;
  }
  GVar3 = *pGVar9;
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data0");
  glu::CallLogWrapper::glProgramUniform3ui(this_00,GVar3,GVar4,1,2,3);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data1");
  glu::CallLogWrapper::glProgramUniform2i(this_00,GVar3,GVar4,1,2);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[0],0,0x34);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[0]);
  glu::CallLogWrapper::glDrawElementsInstanced(this_00,5,4,0x1403,(void *)0x0,1);
  local_40.m_data[0] = 0.0;
  local_40.m_data[1] = 1.0;
  local_40.m_data[2] = 0.0;
  bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_40);
  lVar8 = -1;
  if (bVar2) {
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data0");
    glu::CallLogWrapper::glProgramUniform3ui(this_00,GVar3,GVar4,4,5,6);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data1");
    glu::CallLogWrapper::glProgramUniform2i(this_00,GVar3,GVar4,3,4);
    GVar7 = 0;
    glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[1],8,0x40);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[1]);
    glu::CallLogWrapper::glDrawElementsInstanced(this_00,5,4,0x1405,(void *)0x0,1);
    local_50.m_data[0] = 0.0;
    local_50.m_data[1] = 0.0;
    local_50.m_data[2] = 1.0;
    bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_50);
    if (bVar2) {
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0,0,0,0);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data0");
      glu::CallLogWrapper::glProgramUniform3ui(this_00,GVar3,GVar4,1,2,3);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data1");
      glu::CallLogWrapper::glProgramUniform2i(this_00,GVar3,GVar4,1,2);
      do {
        glu::CallLogWrapper::glVertexAttribBinding(this_00,GVar7,0xf);
        GVar7 = GVar7 + 1;
      } while (GVar7 != 5);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0xf,this->m_vbo[0],0,0x34);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[0]);
      glu::CallLogWrapper::glDrawElementsInstanced(this_00,5,4,0x1403,(void *)0x0,1);
      local_60.m_data[0] = 0.0;
      local_60.m_data[1] = 1.0;
      local_60.m_data[2] = 0.0;
      bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_60);
      if (bVar2) {
        glu::CallLogWrapper::glBindVertexBuffer(this_00,0xf,0,0,0);
        GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data0");
        glu::CallLogWrapper::glProgramUniform3ui(this_00,GVar3,GVar4,1,2,3);
        GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data1");
        glu::CallLogWrapper::glProgramUniform2i(this_00,GVar3,GVar4,3,4);
        glu::CallLogWrapper::glBindVertexBuffer(this_00,7,this->m_vbo[0],0,0x34);
        glu::CallLogWrapper::glBindVertexBuffer(this_00,0xc,this->m_vbo[1],8,0x40);
        glu::CallLogWrapper::glVertexAttribBinding(this_00,0,7);
        glu::CallLogWrapper::glVertexAttribBinding(this_00,1,0xc);
        glu::CallLogWrapper::glVertexAttribBinding(this_00,2,0xc);
        glu::CallLogWrapper::glVertexAttribBinding(this_00,3,7);
        glu::CallLogWrapper::glVertexAttribBinding(this_00,4,0xc);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[0]);
        glu::CallLogWrapper::glDrawElementsInstanced(this_00,5,4,0x1403,(void *)0x0,1);
        local_70.m_data[0] = 0.0;
        local_70.m_data[1] = 0.0;
        local_70.m_data[2] = 1.0;
        bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_70);
        if (bVar2) {
          glu::CallLogWrapper::glClear(this_00,0x4000);
          GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data1");
          glu::CallLogWrapper::glProgramUniform2i(this_00,GVar3,GVar4,0,0);
          glu::CallLogWrapper::glDisableVertexAttribArray(this_00,4);
          glu::CallLogWrapper::glVertexAttribI4i(this_00,4,0,0,0,0);
          glu::CallLogWrapper::glDrawElementsInstanced(this_00,5,4,0x1403,(void *)0x0,1);
          local_80.m_data[0] = 0.0;
          local_80.m_data[1] = 0.0;
          local_80.m_data[2] = 1.0;
          bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_80);
          if (bVar2) {
            GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data0");
            glu::CallLogWrapper::glProgramUniform3ui(this_00,GVar3,GVar4,4,5,6);
            GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_expected_data1");
            glu::CallLogWrapper::glProgramUniform2i(this_00,GVar3,GVar4,1,2);
            glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
            glu::CallLogWrapper::glDrawElementsInstanced(this_00,5,4,0x1405,(void *)0x0,1);
            local_90.m_data[0] = 0.0;
            local_90.m_data[1] = 1.0;
            local_90.m_data[2] = 1.0;
            bVar2 = VertexAttribBindingBase::CheckFB(&this->super_VertexAttribBindingBase,&local_90)
            ;
            lVar8 = (ulong)bVar2 - 1;
          }
        }
      }
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 310 es" NL "layout(location = 0) in vec4 vs_in_position;" NL
			"layout(location = 1) in vec2 vs_in_color_rg;" NL "layout(location = 2) in float vs_in_color_b;" NL
			"layout(location = 3) in uvec3 vs_in_data0;" NL "layout(location = 4) in ivec2 vs_in_data1;" NL
			"out vec2 color_rg;" NL "out float color_b;" NL "flat out uvec3 data0;" NL "flat out ivec2 data1;" NL
			"void main() {" NL "  data0 = vs_in_data0;" NL "  data1 = vs_in_data1;" NL "  color_b = vs_in_color_b;" NL
			"  color_rg = vs_in_color_rg;" NL "  gl_Position = vs_in_position;" NL "}";
		const char* const glsl_fs =
			"#version 310 es" NL "precision highp float;" NL "precision highp int;" NL "in vec2 color_rg;" NL
			"in float color_b;" NL "flat in uvec3 data0;" NL "flat in ivec2 data1;" NL "out vec4 fs_out_color;" NL
			"uniform uvec3 g_expected_data0;" NL "uniform ivec2 g_expected_data1;" NL "void main() {" NL
			"  fs_out_color = vec4(color_rg, color_b, 1);" NL
			"  if (data0 != g_expected_data0) fs_out_color = vec4(1);" NL
			"  if (data1 != g_expected_data1) fs_out_color = vec4(1);" NL "}";
		if (pipeline)
		{
			m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
			if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
				return ERROR;
			glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
			glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);
		}
		else
		{
			m_ppo			 = glCreateProgram();
			const GLuint sh  = glCreateShader(GL_VERTEX_SHADER);
			const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glShaderSource(fsh, 1, &glsl_fs, NULL);
			glCompileShader(sh);
			glCompileShader(fsh);
			glAttachShader(m_ppo, sh);
			glAttachShader(m_ppo, fsh);
			glDeleteShader(sh);
			glDeleteShader(fsh);
			glLinkProgram(m_ppo);
			if (!CheckProgram(m_ppo))
				return ERROR;
		}

		const GLsizei  kStride[2] = { 52, 64 };
		const GLintptr kOffset[2] = { 0, 8 };
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		/* first VBO */
		{
			glBufferData(GL_ARRAY_BUFFER, kOffset[0] + 4 * kStride[0], NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(
				glMapBufferRange(GL_ARRAY_BUFFER, 0, kOffset[0] + 4 * kStride[0], GL_MAP_WRITE_BIT));
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 0 * kStride[0]]) = Vec2(-1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 1 * kStride[0]]) = Vec2(1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 2 * kStride[0]]) = Vec2(1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 3 * kStride[0]]) = Vec2(-1.0f, 1.0f);
			for (int i = 0; i < 4; ++i)
			{
				*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 8 + i * kStride[0]])   = Vec2(0.0f, 1.0f);
				*reinterpret_cast<float*>(&ptr[kOffset[0] + 16 + i * kStride[0]]) = 0.0f;
				*reinterpret_cast<UVec3*>(&ptr[kOffset[0] + 20 + i * kStride[0]]) = UVec3(1, 2, 3);
				*reinterpret_cast<IVec2*>(&ptr[kOffset[0] + 44 + i * kStride[0]]) = IVec2(1, 2);
			}
			glUnmapBuffer(GL_ARRAY_BUFFER);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		/* second VBO */
		{
			glBufferData(GL_ARRAY_BUFFER, kOffset[1] + 4 * kStride[1], NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(
				glMapBufferRange(GL_ARRAY_BUFFER, 0, kOffset[1] + 4 * kStride[1], GL_MAP_WRITE_BIT));
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 0 * kStride[1]]) = Vec2(-1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 1 * kStride[1]]) = Vec2(1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 2 * kStride[1]]) = Vec2(1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 3 * kStride[1]]) = Vec2(-1.0f, -1.0f);
			for (int i = 0; i < 4; ++i)
			{
				*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 8 + i * kStride[1]])   = Vec2(0.0f, 0.0f);
				*reinterpret_cast<float*>(&ptr[kOffset[1] + 16 + i * kStride[1]]) = 1.0f;
				*reinterpret_cast<UVec3*>(&ptr[kOffset[1] + 20 + i * kStride[1]]) = UVec3(4, 5, 6);
				*reinterpret_cast<IVec2*>(&ptr[kOffset[1] + 44 + i * kStride[1]]) = IVec2(3, 4);
			}
			glUnmapBuffer(GL_ARRAY_BUFFER);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		/* first EBO */
		{
			GLushort data[4] = { 0, 1, 3, 2 };
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		/* second EBO */
		{
			GLuint data[4] = { 3, 2, 0, 1 };
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao[0]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(3, 3, GL_UNSIGNED_INT, 20);
		glVertexAttribIFormat(4, 2, GL_INT, 44);
		for (GLuint i = 0; i < 5; ++i)
		{
			glVertexAttribBinding(i, 0);
			glEnableVertexAttribArray(i);
		}
		glBindVertexArray(m_vao[1]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(3, 3, GL_UNSIGNED_INT, 20);
		glVertexAttribIFormat(4, 2, GL_INT, 44);
		glVertexAttribBinding(0, 1);
		glVertexAttribBinding(1, 8);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(3, 1);
		glVertexAttribBinding(4, 8);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(3);
		glEnableVertexAttribArray(4);
		glBindVertexBuffer(1, m_vbo[1], kOffset[1], kStride[1]);
		glBindVertexBuffer(8, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		GLuint ppo;
		if (pipeline)
		{
			glBindProgramPipeline(m_ppo);
			ppo = m_fsp;
		}
		else
		{
			glUseProgram(m_ppo);
			ppo = m_ppo;
		}
		glBindVertexArray(m_vao[0]);

		// Bind first VBO
		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 1, 2, 3);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 1, 2);
		glBindVertexBuffer(0, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1);

		bool status = true;
		if (!CheckFB(Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		// Bind second VBO (change all vertex attribs with one call)
		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 4, 5, 6);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 3, 4);

		glBindVertexBuffer(0, m_vbo[1], kOffset[1], kStride[1]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1);

		if (!CheckFB(Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		// Change attrib bindings (all attribs from one buffer)
		glBindVertexBuffer(0, 0, 0, 0); // "unbind" buffer

		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 1, 2, 3);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 1, 2);

		for (GLuint i = 0; i < 5; ++i)
			glVertexAttribBinding(i, 15);
		glBindVertexBuffer(15, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1);

		if (!CheckFB(Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		// Change attrib bindings (attribs from two buffers)
		glBindVertexBuffer(15, 0, 0, 0); // "unbind" buffer

		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 1, 2, 3);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 3, 4);

		glBindVertexBuffer(7, m_vbo[0], kOffset[0], kStride[0]);
		glBindVertexBuffer(12, m_vbo[1], kOffset[1], kStride[1]);
		glVertexAttribBinding(0, 7);
		glVertexAttribBinding(1, 12);
		glVertexAttribBinding(2, 12);
		glVertexAttribBinding(3, 7);
		glVertexAttribBinding(4, 12);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1);

		if (!CheckFB(Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		// Disable one of the attribs
		glClear(GL_COLOR_BUFFER_BIT);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 0, 0);
		glDisableVertexAttribArray(4);
		glVertexAttribI4i(4, 0, 0, 0, 0);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1);

		if (!CheckFB(Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		// Change VAO
		glProgramUniform3ui(ppo, glGetUniformLocation(ppo, "g_expected_data0"), 4, 5, 6);
		glProgramUniform2i(ppo, glGetUniformLocation(ppo, "g_expected_data1"), 1, 2);

		glBindVertexArray(m_vao[1]);
		glDrawElementsInstanced(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1);

		if (!CheckFB(Vec3(0, 1, 1)))
			status = false;
		if (!status)
			return ERROR;

		return NO_ERROR;
	}